

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDAWBICMetropolisSampler.cpp
# Opt level: O0

vector<double,_std::allocator<double>_> *
readHyperParam(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
              string *hyperParamFilename)

{
  byte bVar1;
  bool bVar2;
  istream *piVar3;
  float fVar4;
  double local_400;
  double temp;
  istringstream stream;
  string local_278 [8];
  string token;
  string local_258 [8];
  string str;
  long local_220;
  ifstream ifs;
  string *hyperParamFilename_local;
  vector<double,_std::allocator<double>_> *param;
  
  std::ifstream::ifstream(&local_220,(string *)hyperParamFilename,_S_in);
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::operator<<((ostream *)&std::cout,"error");
    exit(1);
  }
  std::__cxx11::string::string(local_258);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&local_220,local_258);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar2) break;
    std::__cxx11::string::string(local_278);
    std::__cxx11::istringstream::istringstream((istringstream *)&temp,local_258,_S_in);
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&temp,local_278,'\n');
      bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
      if (!bVar2) break;
      fVar4 = std::__cxx11::stof((string *)local_278,(size_t *)0x0);
      local_400 = (double)fVar4;
      std::vector<double,_std::allocator<double>_>::push_back(__return_storage_ptr__,&local_400);
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)&temp);
    std::__cxx11::string::~string(local_278);
  }
  std::__cxx11::string::~string(local_258);
  std::ifstream::~ifstream(&local_220);
  return __return_storage_ptr__;
}

Assistant:

vector<double> readHyperParam(string hyperParamFilename){
    ifstream ifs(hyperParamFilename);
    vector<double> param;
    if(!ifs){
        cout<<"error";
        exit(1);
    }
    string str;
    while(getline(ifs,str)){
        string token;
        istringstream stream(str);
        while(getline(stream,token,'\n')){
            double temp=stof(token);
            param.push_back(temp);
        }
    }
    return param;
}